

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void func_regs_finish(MIR_context_t ctx,MIR_func_t func)

{
  VARR_reg_desc_t **varr;
  func_regs_t func_regs;
  MIR_func_t func_local;
  MIR_context_t ctx_local;
  
  varr = (VARR_reg_desc_t **)func->internal;
  VARR_reg_desc_tdestroy(varr);
  HTAB_size_t_destroy((HTAB_size_t **)(varr + 1));
  HTAB_size_t_destroy((HTAB_size_t **)(varr + 2));
  HTAB_size_t_destroy((HTAB_size_t **)(varr + 3));
  free(func->internal);
  func->internal = (void *)0x0;
  return;
}

Assistant:

static void func_regs_finish (MIR_context_t ctx MIR_UNUSED, MIR_func_t func) {
  func_regs_t func_regs = func->internal;

  VARR_DESTROY (reg_desc_t, func_regs->reg_descs);
  HTAB_DESTROY (size_t, func_regs->name2rdn_tab);
  HTAB_DESTROY (size_t, func_regs->hrn2rdn_tab);
  HTAB_DESTROY (size_t, func_regs->reg2rdn_tab);
  free (func->internal);
  func->internal = NULL;
}